

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::write
          (BlockedRead *this,int __fd,void *__buf,size_t __n)

{
  ArrayPtr<const_unsigned_char> data;
  bool bVar1;
  Tag TVar2;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
  *pOVar3;
  Done *pDVar4;
  Retry *pRVar5;
  undefined4 in_register_00000034;
  BlockedRead *this_00;
  Fault local_130;
  Fault f_1;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *local_120;
  undefined1 local_118 [8];
  DebugComparison<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_&,_std::nullptr_t>
  _kjCondition_1;
  Retry *_kj_switch_done_1;
  Retry *retry;
  Done *_kj_switch_done;
  Done *done;
  uchar *local_b8;
  size_t sStack_b0;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
  local_a0;
  undefined1 local_78 [8];
  NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
  _kj_switch_subject;
  Fault local_38;
  Fault f;
  DebugExpression<bool> _kjCondition;
  BlockedRead *this_local;
  ArrayPtr<const_unsigned_char> buffer_local;
  
  this_00 = (BlockedRead *)CONCAT44(in_register_00000034,__fd);
  f.exception._6_1_ = Canceler::isEmpty(&this_00->canceler);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3b4,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),(char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&local_38);
  }
  local_b8 = (uchar *)__buf;
  sStack_b0 = __n;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::ArrayPtr
            ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&done,(void *)0x0);
  data.size_ = sStack_b0;
  data.ptr = local_b8;
  writeImpl(&local_a0,this_00,data,_done);
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
  ::_switchSubject((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
                    *)local_78,&local_a0);
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
  ::~OneOf(&local_a0);
  pOVar3 = kj::_::
           NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
           ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
                         *)local_78);
  TVar2 = OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
          ::which(pOVar3);
  if (TVar2 == _variant0) {
    pOVar3 = kj::_::
             NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
             ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
                           *)local_78);
    pDVar4 = OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
             ::get<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done>(pOVar3);
    if (pDVar4 == (Done *)0x0) {
      retry._4_4_ = 5;
    }
    else {
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
      retry._4_4_ = 1;
    }
  }
  else {
    if (TVar2 == _variant1) {
      pOVar3 = kj::_::
               NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
               ::operator->((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
                             *)local_78);
      pRVar5 = OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
               ::get<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>(pOVar3);
      _kjCondition_1._32_8_ = pRVar5;
      if (pRVar5 != (Retry *)0x0) {
        local_120 = (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)
                    kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&pRVar5->moreData);
        f_1.exception = (Exception *)0x0;
        kj::_::DebugExpression<kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>&>::operator==
                  ((DebugComparison<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_&,_std::nullptr_t>
                    *)local_118,
                   (DebugExpression<kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>&> *)
                   &local_120,&f_1.exception);
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_118);
        if (!bVar1) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>&,decltype(nullptr)>&>
                    (&local_130,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                     ,0x3bb,FAILED,"retry.moreData == nullptr","_kjCondition,",
                     (DebugComparison<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_&,_std::nullptr_t>
                      *)local_118);
          kj::_::Debug::Fault::fatal(&local_130);
        }
        AsyncPipe::write((AsyncPipe *)this,(int)this_00->pipe,(pRVar5->data).ptr,
                         (pRVar5->data).size_);
        retry._4_4_ = 1;
        goto LAB_007afa57;
      }
    }
    retry._4_4_ = 0;
  }
LAB_007afa57:
  kj::_::
  NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
  ::~NullableValue((NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
                    *)local_78);
  if ((retry._4_4_ != 0) && (retry._4_4_ == 1)) {
    return (ssize_t)this;
  }
  kj::_::unreachable();
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      KJ_SWITCH_ONEOF(writeImpl(buffer, nullptr)) {
        KJ_CASE_ONEOF(done, Done) {
          return READY_NOW;
        }
        KJ_CASE_ONEOF(retry, Retry) {
          KJ_ASSERT(retry.moreData == nullptr);
          return pipe.write(retry.data);
        }
      }
      KJ_UNREACHABLE;
    }